

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpair.c
# Opt level: O0

int nn_xpair_events(nn_sockbase *self)

{
  int iVar1;
  nn_sockbase *local_28;
  uint local_1c;
  int events;
  nn_xpair *xpair;
  nn_sockbase *self_local;
  
  local_28 = self;
  if (self == (nn_sockbase *)0x0) {
    local_28 = (nn_sockbase *)0x0;
  }
  iVar1 = nn_excl_can_recv((nn_excl *)(local_28 + 1));
  local_1c = (uint)(iVar1 != 0);
  iVar1 = nn_excl_can_send((nn_excl *)(local_28 + 1));
  if (iVar1 != 0) {
    local_1c = local_1c | 2;
  }
  return local_1c;
}

Assistant:

static int nn_xpair_events (struct nn_sockbase *self)
{
    struct nn_xpair *xpair;
    int events;

    xpair = nn_cont (self, struct nn_xpair, sockbase);

    events = 0;
    if (nn_excl_can_recv (&xpair->excl))
        events |= NN_SOCKBASE_EVENT_IN;
    if (nn_excl_can_send (&xpair->excl))
        events |= NN_SOCKBASE_EVENT_OUT;
    return events;
}